

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRestruct.c
# Opt level: O3

Dec_Edge_t
Abc_NodeEvaluateDsd_rec
          (Dec_Graph_t *pGraph,Abc_ManRst_t *pManRst,Dsd_Node_t *pNodeDsd,int Required,
          int nNodesSaved,int *pnNodesAdded)

{
  DdHalfWord DVar1;
  void *pvVar2;
  long lVar3;
  Dsd_Type_t DVar4;
  int iVar5;
  int iVar6;
  Dec_Edge_t DVar7;
  uint uVar8;
  DdNode *pDVar9;
  Vec_Int_t *pVVar10;
  int *piVar11;
  Dsd_Node_t *pNodeDsd_00;
  Abc_Obj_t *pAVar12;
  Dec_Node_t *pDVar13;
  DdNode *n;
  DdNode *n_00;
  DdNode *n_01;
  int iVar14;
  int iVar15;
  uint uVar16;
  int Fill;
  int Fill_00;
  int Fill_01;
  void *pvVar17;
  uint uVar18;
  ulong uVar19;
  bool bVar20;
  Abc_Aig_t *pAVar21;
  ulong uVar22;
  uint uVar23;
  long *plVar24;
  byte bVar25;
  Dsd_Node_t *p;
  ulong uVar26;
  Abc_Obj_t *pAVar27;
  Dec_Edge_t DVar28;
  ulong uVar29;
  Abc_Obj_t *pAVar30;
  int Type;
  bool local_d1;
  int local_b4;
  int *local_b0;
  Abc_Obj_t *local_a8;
  Vec_Int_t *local_a0;
  Abc_Obj_t *local_98;
  int local_90;
  int local_8c;
  Abc_Obj_t *local_88;
  ulong local_80;
  Abc_Obj_t *local_78;
  long local_70;
  undefined8 local_68;
  Abc_Obj_t *local_60;
  Abc_Obj_t *local_58;
  undefined8 local_50;
  Dsd_Node_t *local_48;
  ulong local_40;
  ulong local_38;
  
  p = (Dsd_Node_t *)((ulong)pNodeDsd & 0xfffffffffffffffe);
  local_90 = Required;
  local_8c = nNodesSaved;
  DVar4 = Dsd_NodeReadType(p);
  if (DVar4 == DSD_NODE_BUF) {
    pDVar9 = Dsd_NodeReadFunc(p);
    if (pGraph->nLeaves <= (int)pDVar9->index) {
      __assert_fail("Index < Dec_GraphLeaveNum(pGraph)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcRestruct.c"
                    ,0x261,
                    "Dec_Edge_t Abc_NodeEvaluateDsd_rec(Dec_Graph_t *, Abc_ManRst_t *, Dsd_Node_t *, int, int, int *)"
                   );
    }
    return (Dec_Edge_t)(((uint)pNodeDsd & 1) + (pDVar9->index & 0x3fffffff) * 2);
  }
  local_48 = pNodeDsd;
  if (2 < DVar4 - DSD_NODE_OR) {
    __assert_fail("DecType == DSD_NODE_OR || DecType == DSD_NODE_EXOR || DecType == DSD_NODE_PRIME",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcRestruct.c"
                  ,0x265,
                  "Dec_Edge_t Abc_NodeEvaluateDsd_rec(Dec_Graph_t *, Abc_ManRst_t *, Dsd_Node_t *, int, int, int *)"
                 );
  }
  iVar5 = Dsd_NodeReadDecsNum(p);
  pVVar10 = (Vec_Int_t *)malloc(0x10);
  iVar6 = 0x10;
  if (0xe < iVar5 - 1U) {
    iVar6 = iVar5;
  }
  pVVar10->nSize = 0;
  pVVar10->nCap = iVar6;
  if (iVar6 == 0) {
    piVar11 = (int *)0x0;
  }
  else {
    piVar11 = (int *)malloc((long)iVar6 << 2);
  }
  pVVar10->pArray = piVar11;
  iVar6 = Dsd_NodeReadDecsNum(p);
  if (0 < iVar6) {
    iVar6 = 0;
    do {
      pNodeDsd_00 = Dsd_NodeReadDec(p,iVar6);
      DVar7 = Abc_NodeEvaluateDsd_rec(pGraph,pManRst,pNodeDsd_00,local_90,local_8c,pnNodesAdded);
      if (((uint)DVar7 & 0x7ffffffe) == 0xfac) goto LAB_002a2069;
      if (DVar4 == DSD_NODE_PRIME) {
        Vec_IntPush(pVVar10,(int)DVar7);
      }
      else {
        Abc_NodeEdgeDsdPushOrdered(pGraph,pVVar10,(int)DVar7);
      }
      iVar6 = iVar6 + 1;
      iVar5 = Dsd_NodeReadDecsNum(p);
    } while (iVar6 < iVar5);
  }
  local_b0 = pnNodesAdded;
  local_a0 = pVVar10;
  if (DVar4 == DSD_NODE_EXOR) {
    uVar16 = pVVar10->nSize;
    if ((int)uVar16 < 2) {
      __assert_fail("Vec_IntSize(vEdges) > 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcRestruct.c"
                    ,0x2b5,
                    "Dec_Edge_t Abc_NodeEvaluateDsd_rec(Dec_Graph_t *, Abc_ManRst_t *, Dsd_Node_t *, int, int, int *)"
                   );
    }
    do {
      if (uVar16 != 2) {
        Abc_NodeEdgeDsdPermute(pGraph,pManRst,pVVar10,1);
      }
      uVar8 = pVVar10->pArray[(ulong)uVar16 - 1];
      DVar7 = (Dec_Edge_t)(uVar8 & 0x7fffffff);
      pVVar10->nSize = uVar16 - 2;
      uVar16 = pVVar10->pArray[uVar16 - 2];
      DVar28 = (Dec_Edge_t)(uVar16 & 0x7fffffff);
      pDVar13 = pGraph->pNodes;
      local_80 = (ulong)((uint)DVar7 >> 1) * 3;
      local_98 = (Abc_Obj_t *)((ulong)((uint)DVar28 >> 1) * 3);
      pvVar2 = pDVar13[(uint)DVar28 >> 1].field_2.pFunc;
      local_78 = (Abc_Obj_t *)((ulong)(uVar8 & 1) ^ (ulong)pDVar13[(uint)DVar7 >> 1].field_2.pFunc);
      if (pDVar13[(uint)DVar7 >> 1].field_2.pFunc == (void *)0x0) {
        local_78 = (Abc_Obj_t *)0x0;
      }
      if (pvVar2 == (void *)0x0) {
        local_b4 = 0;
        local_a8 = (Abc_Obj_t *)0x0;
        local_88 = (Abc_Obj_t *)0x0;
        local_70 = 0;
LAB_002a1682:
        iVar6 = pGraph->nSize;
        if (iVar6 == pGraph->nCap) {
          if (pDVar13 == (Dec_Node_t *)0x0) {
            pDVar13 = (Dec_Node_t *)malloc((long)iVar6 * 0x30);
            iVar5 = iVar6;
          }
          else {
            pDVar13 = (Dec_Node_t *)realloc(pDVar13,(long)iVar6 * 0x30);
            iVar6 = pGraph->nSize;
            iVar5 = pGraph->nCap;
          }
          pGraph->pNodes = pDVar13;
          pGraph->nCap = iVar5 * 2;
          pnNodesAdded = local_b0;
        }
        pGraph->nSize = iVar6 + 1;
        pDVar13[iVar6].field_2.pFunc = (void *)0x0;
        (&pDVar13[iVar6].field_2)[1].pFunc = (void *)0x0;
        pDVar13[iVar6].eEdge0 = (Dec_Edge_t)((uint)DVar7 ^ 1);
        pDVar13[iVar6].eEdge1 = DVar28;
        *(uint *)&pDVar13[iVar6].field_0x10 = (uVar16 & 1) << 0x10 | (((uint)DVar7 ^ 1) & 1) << 0xf;
        iVar5 = pGraph->nSize;
        iVar6 = iVar5 * 2;
        pDVar13 = pGraph->pNodes;
        if (iVar5 == pGraph->nCap) {
          if (pDVar13 == (Dec_Node_t *)0x0) {
            pDVar13 = (Dec_Node_t *)malloc((long)iVar6 * 0x18);
            iVar14 = iVar6;
          }
          else {
            pDVar13 = (Dec_Node_t *)realloc(pDVar13,(long)iVar6 * 0x18);
            iVar5 = pGraph->nSize;
            iVar14 = pGraph->nCap * 2;
          }
          pGraph->pNodes = pDVar13;
          pGraph->nCap = iVar14;
        }
        pVVar10 = local_a0;
        pGraph->nSize = iVar5 + 1;
        pDVar13[iVar5].field_2.pFunc = (void *)0x0;
        (&pDVar13[iVar5].field_2)[1].pFunc = (void *)0x0;
        pDVar13[iVar5].eEdge0 = DVar7;
        pDVar13[iVar5].eEdge1 = (Dec_Edge_t)((uint)DVar28 ^ 1);
        *(uint *)&pDVar13[iVar5].field_0x10 = (((uint)DVar28 ^ 1) & 1) << 0x10 | (uVar8 & 1) << 0xf;
        iVar5 = pGraph->nSize;
        iVar14 = iVar5 * 2;
        pDVar13 = pGraph->pNodes;
        if (iVar5 == pGraph->nCap) {
          if (pDVar13 == (Dec_Node_t *)0x0) {
            pDVar13 = (Dec_Node_t *)malloc((long)iVar14 * 0x18);
            iVar15 = iVar14;
          }
          else {
            pDVar13 = (Dec_Node_t *)realloc(pDVar13,(long)iVar14 * 0x18);
            iVar5 = pGraph->nSize;
            iVar15 = pGraph->nCap * 2;
          }
          pGraph->pNodes = pDVar13;
          pGraph->nCap = iVar15;
        }
        pGraph->nSize = iVar5 + 1;
        pDVar13[iVar5].field_2.pFunc = (void *)0x0;
        (&pDVar13[iVar5].field_2)[1].pFunc = (void *)0x0;
        *(undefined4 *)&pDVar13[iVar5].field_0x10 = 0x4000;
        pDVar13[iVar5].eEdge0 = (Dec_Edge_t)(iVar6 + 0x7ffffffeU & 0x7ffffffe | 1);
        pDVar13[iVar5].eEdge1 = (Dec_Edge_t)(iVar14 + 0x7ffffffeU & 0x7ffffffe | 1);
        uVar16 = (pGraph->nSize * 2 + 0x7ffffffeU & 0x7ffffffe) + 1;
      }
      else {
        local_88 = (Abc_Obj_t *)((ulong)pvVar2 ^ (ulong)(uVar16 & 1));
        local_b4 = 0;
        local_a8 = (Abc_Obj_t *)0x0;
        local_70 = 0;
        if ((local_78 == (Abc_Obj_t *)0x0) || ((void *)(ulong)(uVar16 & 1) == pvVar2))
        goto LAB_002a1682;
        piVar11 = &local_b4;
        local_a8 = Abc_AigXorLookup((Abc_Aig_t *)pManRst->pNtk->pManFunc,local_78,local_88,piVar11);
        pDVar13 = pGraph->pNodes;
        if (local_b4 == 0) {
          local_70 = CONCAT71((int7)((ulong)piVar11 >> 8),1);
          goto LAB_002a1682;
        }
        iVar6 = pGraph->nSize;
        if (iVar6 == pGraph->nCap) {
          if (pDVar13 == (Dec_Node_t *)0x0) {
            pDVar13 = (Dec_Node_t *)malloc((long)iVar6 * 0x30);
            iVar5 = iVar6;
          }
          else {
            pDVar13 = (Dec_Node_t *)realloc(pDVar13,(long)iVar6 * 0x30);
            iVar6 = pGraph->nSize;
            iVar5 = pGraph->nCap;
          }
          pGraph->pNodes = pDVar13;
          pGraph->nCap = iVar5 * 2;
          pnNodesAdded = local_b0;
        }
        pGraph->nSize = iVar6 + 1;
        pDVar13[iVar6].field_2.pFunc = (void *)0x0;
        (&pDVar13[iVar6].field_2)[1].pFunc = (void *)0x0;
        pDVar13[iVar6].eEdge0 = DVar7;
        pDVar13[iVar6].eEdge1 = DVar28;
        *(uint *)&pDVar13[iVar6].field_0x10 = (uVar16 & 1) << 0x10 | (uVar8 & 1) << 0xf;
        iVar5 = pGraph->nSize;
        iVar6 = iVar5 * 2;
        pDVar13 = pGraph->pNodes;
        if (iVar5 == pGraph->nCap) {
          if (pDVar13 == (Dec_Node_t *)0x0) {
            pDVar13 = (Dec_Node_t *)malloc((long)iVar6 * 0x18);
            iVar14 = iVar6;
          }
          else {
            pDVar13 = (Dec_Node_t *)realloc(pDVar13,(long)iVar6 * 0x18);
            iVar5 = pGraph->nSize;
            iVar14 = pGraph->nCap * 2;
          }
          pGraph->pNodes = pDVar13;
          pGraph->nCap = iVar14;
        }
        pVVar10 = local_a0;
        pGraph->nSize = iVar5 + 1;
        pDVar13[iVar5].field_2.pFunc = (void *)0x0;
        (&pDVar13[iVar5].field_2)[1].pFunc = (void *)0x0;
        pDVar13[iVar5].eEdge0 = (Dec_Edge_t)((uint)DVar7 ^ 1);
        pDVar13[iVar5].eEdge1 = (Dec_Edge_t)((uint)DVar28 ^ 1);
        *(uint *)&pDVar13[iVar5].field_0x10 =
             (((uint)DVar28 ^ 1) & 1) << 0x10 | (((uint)DVar7 ^ 1) & 1) << 0xf;
        iVar5 = pGraph->nSize;
        iVar14 = iVar5 * 2;
        pDVar13 = pGraph->pNodes;
        if (iVar5 == pGraph->nCap) {
          if (pDVar13 == (Dec_Node_t *)0x0) {
            pDVar13 = (Dec_Node_t *)malloc((long)iVar14 * 0x18);
            iVar15 = iVar14;
          }
          else {
            pDVar13 = (Dec_Node_t *)realloc(pDVar13,(long)iVar14 * 0x18);
            iVar5 = pGraph->nSize;
            iVar15 = pGraph->nCap * 2;
          }
          pGraph->pNodes = pDVar13;
          pGraph->nCap = iVar15;
        }
        pGraph->nSize = iVar5 + 1;
        pDVar13[iVar5].field_2.pFunc = (void *)0x0;
        (&pDVar13[iVar5].field_2)[1].pFunc = (void *)0x0;
        *(undefined4 *)&pDVar13[iVar5].field_0x10 = 0x4000;
        pDVar13[iVar5].eEdge0 = (Dec_Edge_t)(iVar6 + 0x7ffffffeU & 0x7ffffffe | 1);
        pDVar13[iVar5].eEdge1 = (Dec_Edge_t)(iVar14 + 0x7ffffffeU & 0x7ffffffe | 1);
        uVar16 = pGraph->nSize * 2 + 0x7ffffffeU & 0x7ffffffe;
        local_70 = CONCAT71((int7)((ulong)pDVar13 >> 8),1);
      }
      pDVar13 = pGraph->pNodes;
      uVar18 = *(uint *)(&pDVar13->field_0x10 + local_80 * 8) & 0x3fff;
      uVar8 = *(uint *)(&pDVar13->field_0x10 + (long)local_98 * 8) & 0x3fff;
      if (uVar8 < uVar18) {
        uVar8 = uVar18;
      }
      uVar18 = uVar16 >> 1;
      *(uint *)&pDVar13[uVar18].field_0x10 =
           *(uint *)&pDVar13[uVar18].field_0x10 & 0xffffc000 | uVar8 + 2 & 0x3fff;
      if (local_a8 == (Abc_Obj_t *)0x0) {
LAB_002a1925:
        iVar6 = *pnNodesAdded;
        *pnNodesAdded = iVar6 + 1;
        if ((char)local_70 == '\0') {
          iVar6 = iVar6 + 3;
LAB_002a1ade:
          *pnNodesAdded = iVar6;
        }
        else {
          pAVar21 = (Abc_Aig_t *)pManRst->pNtk->pManFunc;
          if (local_b4 == 0) {
            pAVar30 = Abc_AigAndLookup(pAVar21,local_78,(Abc_Obj_t *)((ulong)local_88 ^ 1));
            if (pAVar30 == (Abc_Obj_t *)0x0) {
LAB_002a1a4b:
              *local_b0 = *local_b0 + 1;
            }
            else {
              plVar24 = (long *)((ulong)pAVar30 & 0xfffffffffffffffe);
              lVar3 = *plVar24;
              iVar6 = (int)plVar24[2];
              Vec_IntFillExtra((Vec_Int_t *)(lVar3 + 0xe0),iVar6 + 1,Fill_00);
              if (((long)iVar6 < 0) || (*(int *)(lVar3 + 0xe4) <= iVar6)) goto LAB_002a26ae;
              if (*(int *)(*(long *)(lVar3 + 0xe8) + (long)iVar6 * 4) == *(int *)(*plVar24 + 0xd8))
              goto LAB_002a1a4b;
            }
            pAVar21 = (Abc_Aig_t *)pManRst->pNtk->pManFunc;
            pAVar30 = (Abc_Obj_t *)((ulong)local_78 ^ 1);
          }
          else {
            pAVar30 = Abc_AigAndLookup(pAVar21,(Abc_Obj_t *)((ulong)local_78 ^ 1),
                                       (Abc_Obj_t *)((ulong)local_88 ^ 1));
            if (pAVar30 == (Abc_Obj_t *)0x0) {
LAB_002a19be:
              *local_b0 = *local_b0 + 1;
            }
            else {
              plVar24 = (long *)((ulong)pAVar30 & 0xfffffffffffffffe);
              lVar3 = *plVar24;
              iVar6 = (int)plVar24[2];
              Vec_IntFillExtra((Vec_Int_t *)(lVar3 + 0xe0),iVar6 + 1,Fill);
              if (((long)iVar6 < 0) || (*(int *)(lVar3 + 0xe4) <= iVar6)) goto LAB_002a26ae;
              if (*(int *)(*(long *)(lVar3 + 0xe8) + (long)iVar6 * 4) == *(int *)(*plVar24 + 0xd8))
              goto LAB_002a19be;
            }
            pAVar21 = (Abc_Aig_t *)pManRst->pNtk->pManFunc;
            pAVar30 = local_78;
          }
          pAVar30 = Abc_AigAndLookup(pAVar21,pAVar30,local_88);
          if (pAVar30 == (Abc_Obj_t *)0x0) {
LAB_002a1ad8:
            iVar6 = *local_b0 + 1;
            pnNodesAdded = local_b0;
            goto LAB_002a1ade;
          }
          plVar24 = (long *)((ulong)pAVar30 & 0xfffffffffffffffe);
          lVar3 = *plVar24;
          iVar6 = (int)plVar24[2];
          Vec_IntFillExtra((Vec_Int_t *)(lVar3 + 0xe0),iVar6 + 1,Fill_01);
          if (((long)iVar6 < 0) || (*(int *)(lVar3 + 0xe4) <= iVar6)) goto LAB_002a26ae;
          pnNodesAdded = local_b0;
          if (*(int *)(*(long *)(lVar3 + 0xe8) + (long)iVar6 * 4) == *(int *)(*plVar24 + 0xd8))
          goto LAB_002a1ad8;
        }
        if (local_8c < *pnNodesAdded) goto LAB_002a2069;
      }
      else {
        pDVar13 = pGraph->pNodes;
        pDVar13[uVar18].field_2.pFunc = (void *)((ulong)(uVar16 & 1) ^ (ulong)local_a8);
        if ((local_90 != 1000000000) &&
           ((*(uint *)&pGraph->pNodes[uVar18].field_0x10 & 0x3fff) !=
            *(uint *)(((ulong)local_a8 & 0xfffffffffffffffe) + 0x14) >> 0xc)) {
          __assert_fail("Required == ABC_INFINITY || Level3 == (int)Abc_ObjRegular(pNode3)->Level",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcRestruct.c"
                        ,0x2d2,
                        "Dec_Edge_t Abc_NodeEvaluateDsd_rec(Dec_Graph_t *, Abc_ManRst_t *, Dsd_Node_t *, int, int, int *)"
                       );
        }
        plVar24 = (long *)((ulong)local_a8 & 0xfffffffffffffffe);
        lVar3 = *plVar24;
        iVar6 = (int)plVar24[2];
        Vec_IntFillExtra((Vec_Int_t *)(lVar3 + 0xe0),iVar6 + 1,(int)pDVar13);
        if (((long)iVar6 < 0) || (*(int *)(lVar3 + 0xe4) <= iVar6)) goto LAB_002a26ae;
        if (*(int *)(*(long *)(lVar3 + 0xe8) + (long)iVar6 * 4) == *(int *)(*plVar24 + 0xd8))
        goto LAB_002a1925;
      }
      Abc_NodeEdgeDsdPushOrdered(pGraph,pVVar10,uVar16);
      uVar16 = pVVar10->nSize;
    } while (1 < (int)uVar16);
  }
  else {
    if (DVar4 != DSD_NODE_OR) {
      if (DVar4 != DSD_NODE_PRIME) {
LAB_002a2069:
        if (pVVar10->pArray != (int *)0x0) {
          free(pVVar10->pArray);
        }
        free(pVVar10);
        return (Dec_Edge_t)0xfac;
      }
      n = Dsd_TreeGetPrimeFunction(pManRst->dd,p);
      Cudd_Ref(n);
      pDVar9 = *pManRst->dd->vars;
      n_00 = Cudd_Cofactor(pManRst->dd,n,(DdNode *)((ulong)pDVar9 ^ 1));
      Cudd_Ref(n_00);
      n_01 = Cudd_Cofactor(pManRst->dd,n,pDVar9);
      Cudd_Ref(n_01);
      iVar6 = Extra_bddIsVar(n_00);
      if ((iVar6 == 0) || (iVar6 = Extra_bddIsVar(n_01), iVar6 == 0)) {
        Cudd_RecursiveDeref(pManRst->dd,n_00);
        Cudd_RecursiveDeref(pManRst->dd,n_01);
        pDVar9 = pManRst->dd->vars[1];
        n_00 = Cudd_Cofactor(pManRst->dd,n,(DdNode *)((ulong)pDVar9 ^ 1));
        Cudd_Ref(n_00);
        n_01 = Cudd_Cofactor(pManRst->dd,n,pDVar9);
        Cudd_Ref(n_01);
        iVar6 = Extra_bddIsVar(n_00);
        if ((iVar6 == 0) || (iVar6 = Extra_bddIsVar(n_01), iVar6 == 0)) {
          Cudd_RecursiveDeref(pManRst->dd,n_00);
          Cudd_RecursiveDeref(pManRst->dd,n_01);
          pDVar9 = pManRst->dd->vars[2];
          n_00 = Cudd_Cofactor(pManRst->dd,n,(DdNode *)((ulong)pDVar9 ^ 1));
          Cudd_Ref(n_00);
          n_01 = Cudd_Cofactor(pManRst->dd,n,pDVar9);
          Cudd_Ref(n_01);
          iVar6 = Extra_bddIsVar(n_00);
          if ((iVar6 == 0) || (iVar6 = Extra_bddIsVar(n_01), iVar6 == 0)) {
            Cudd_RecursiveDeref(pManRst->dd,n_00);
            Cudd_RecursiveDeref(pManRst->dd,n_01);
            Cudd_RecursiveDeref(pManRst->dd,n);
            goto LAB_002a24e2;
          }
        }
      }
      Cudd_RecursiveDeref(pManRst->dd,n);
      DVar1 = pDVar9->index;
      if (((long)(int)DVar1 < 0) || (uVar16 = pVVar10->nSize, (int)uVar16 <= (int)DVar1)) {
LAB_002a26ae:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar8 = *(uint *)((ulong)n_01 & 0xfffffffffffffffe);
      if (((long)(int)uVar8 < 0) || (uVar16 <= uVar8)) goto LAB_002a26ae;
      uVar18 = *(uint *)((ulong)n_00 & 0xfffffffffffffffe);
      if (((long)(int)uVar18 < 0) || (uVar16 <= uVar18)) goto LAB_002a26ae;
      piVar11 = pVVar10->pArray;
      local_38 = (ulong)(uint)piVar11[(int)DVar1];
      DVar7 = (Dec_Edge_t)(piVar11[(int)DVar1] & 0x7fffffff);
      uVar16 = piVar11[(int)uVar8];
      uVar8 = piVar11[(int)uVar18];
      uVar18 = ((uint)n_01 ^ uVar16) & 1;
      uVar26 = (ulong)uVar18;
      local_80 = CONCAT44(local_80._4_4_,uVar16 & 0x7ffffffe | uVar18);
      uVar18 = (uint)n_00 ^ uVar8;
      uVar23 = uVar18 & 1;
      local_a8 = (Abc_Obj_t *)CONCAT44(local_a8._4_4_,uVar8 & 0x7ffffffe | uVar23);
      local_98 = (Abc_Obj_t *)n_01;
      Cudd_RecursiveDeref(pManRst->dd,n_00);
      uVar22 = local_38;
      Cudd_RecursiveDeref(pManRst->dd,(DdNode *)local_98);
      pDVar13 = pGraph->pNodes;
      local_70 = (ulong)((uint)DVar7 >> 1) * 3;
      uVar29 = (ulong)(uVar16 >> 1 & 0x3fffffff);
      local_88 = (Abc_Obj_t *)(uVar29 * 3);
      uVar19 = (ulong)(uVar8 >> 1 & 0x3fffffff);
      local_78 = (Abc_Obj_t *)(uVar19 * 3);
      pvVar2 = pDVar13[uVar19].field_2.pFunc;
      uVar16 = (uint)uVar22;
      pAVar30 = (Abc_Obj_t *)((ulong)(uVar16 & 1) ^ (ulong)pDVar13[(uint)DVar7 >> 1].field_2.pFunc);
      if (pDVar13[(uint)DVar7 >> 1].field_2.pFunc == (void *)0x0) {
        pAVar30 = (Abc_Obj_t *)0x0;
      }
      pAVar27 = (Abc_Obj_t *)(uVar26 ^ (ulong)pDVar13[uVar29].field_2.pFunc);
      if (pDVar13[uVar29].field_2.pFunc == (void *)0x0) {
        pAVar27 = (Abc_Obj_t *)0x0;
      }
      local_50 = CONCAT44(local_50._4_4_,uVar18) & 0xffffffff00000001;
      local_58 = pAVar30;
      local_40 = uVar26;
      if (pvVar2 == (void *)0x0) {
        local_b4 = 0;
        bVar20 = pAVar27 != (Abc_Obj_t *)0x0 && pAVar30 != (Abc_Obj_t *)0x0;
        pAVar12 = (Abc_Obj_t *)0x0;
        local_60 = (Abc_Obj_t *)0x0;
        local_68 = 0;
LAB_002a20cd:
        iVar6 = pGraph->nSize;
        local_98 = pAVar12;
        if (iVar6 == pGraph->nCap) {
          if (pDVar13 == (Dec_Node_t *)0x0) {
            pDVar13 = (Dec_Node_t *)malloc((long)iVar6 * 0x30);
            iVar5 = iVar6;
          }
          else {
            pDVar13 = (Dec_Node_t *)realloc(pDVar13,(long)iVar6 * 0x30);
            iVar6 = pGraph->nSize;
            iVar5 = pGraph->nCap;
          }
          pGraph->pNodes = pDVar13;
          pGraph->nCap = iVar5 * 2;
        }
        pGraph->nSize = iVar6 + 1;
        pDVar13[iVar6].field_2.pFunc = (void *)0x0;
        (&pDVar13[iVar6].field_2)[1].pFunc = (void *)0x0;
        pDVar13[iVar6].eEdge0 = DVar7;
        pDVar13[iVar6].eEdge1 = local_80._0_4_;
        *(uint *)&pDVar13[iVar6].field_0x10 = (int)local_40 << 0x10 | (uVar16 & 1) << 0xf;
        iVar6 = pGraph->nSize;
        iVar5 = iVar6 * 2;
        uVar16 = iVar5 + 0x7ffffffe;
        pDVar13 = pGraph->pNodes;
        if (iVar6 == pGraph->nCap) {
          if (pDVar13 == (Dec_Node_t *)0x0) {
            pDVar13 = (Dec_Node_t *)malloc((long)iVar5 * 0x18);
          }
          else {
            pDVar13 = (Dec_Node_t *)realloc(pDVar13,(long)iVar5 * 0x18);
            iVar6 = pGraph->nSize;
            iVar5 = pGraph->nCap * 2;
          }
          pGraph->pNodes = pDVar13;
          pGraph->nCap = iVar5;
        }
        pAVar12 = local_58;
        pGraph->nSize = iVar6 + 1;
        pDVar13[iVar6].field_2.pFunc = (void *)0x0;
        (&pDVar13[iVar6].field_2)[1].pFunc = (void *)0x0;
        pDVar13[iVar6].eEdge0 = (Dec_Edge_t)((uint)DVar7 ^ 1);
        pDVar13[iVar6].eEdge1 = local_a8._0_4_;
        *(uint *)&pDVar13[iVar6].field_0x10 = (int)local_50 << 0x10 | (((uint)DVar7 ^ 1) & 1) << 0xf
        ;
        iVar6 = pGraph->nSize;
        iVar5 = iVar6 * 2;
        uVar8 = iVar5 + 0x7ffffffe;
        pDVar13 = pGraph->pNodes;
        if (iVar6 == pGraph->nCap) {
          if (pDVar13 == (Dec_Node_t *)0x0) {
            pDVar13 = (Dec_Node_t *)malloc((long)iVar5 * 0x18);
          }
          else {
            pDVar13 = (Dec_Node_t *)realloc(pDVar13,(long)iVar5 * 0x18);
            iVar6 = pGraph->nSize;
            iVar5 = pGraph->nCap * 2;
          }
          pGraph->pNodes = pDVar13;
          pGraph->nCap = iVar5;
        }
        pGraph->nSize = iVar6 + 1;
        pDVar13[iVar6].field_2.pFunc = (void *)0x0;
        (&pDVar13[iVar6].field_2)[1].pFunc = (void *)0x0;
        *(undefined4 *)&pDVar13[iVar6].field_0x10 = 0x4000;
        pDVar13[iVar6].eEdge0 = (Dec_Edge_t)(uVar16 & 0x7ffffffe | 1);
        pDVar13[iVar6].eEdge1 = (Dec_Edge_t)(uVar8 & 0x7ffffffe | 1);
        uVar16 = (pGraph->nSize * 2 + 0x7ffffffeU & 0x7ffffffe) + 1;
      }
      else {
        pvVar17 = (void *)(ulong)uVar23;
        local_60 = (Abc_Obj_t *)((ulong)pvVar2 ^ (ulong)pvVar17);
        local_b4 = 0;
        bVar20 = pAVar27 != (Abc_Obj_t *)0x0 && pAVar30 != (Abc_Obj_t *)0x0;
        local_68 = CONCAT71((int7)((ulong)pvVar2 >> 8),pvVar17 != pvVar2);
        pAVar12 = (Abc_Obj_t *)0x0;
        if ((pAVar27 == (Abc_Obj_t *)0x0 || pAVar30 == (Abc_Obj_t *)0x0) || (pvVar17 == pvVar2))
        goto LAB_002a20cd;
        pAVar12 = Abc_AigMuxLookup((Abc_Aig_t *)pManRst->pNtk->pManFunc,pAVar30,pAVar27,local_60,
                                   &local_b4);
        pDVar13 = pGraph->pNodes;
        if (local_b4 == 0) goto LAB_002a20cd;
        local_80 = local_80 ^ 1;
        iVar6 = pGraph->nSize;
        local_98 = pAVar12;
        if (iVar6 == pGraph->nCap) {
          local_50 = (ulong)(uint)DVar7;
          if (pDVar13 == (Dec_Node_t *)0x0) {
            pDVar13 = (Dec_Node_t *)malloc((long)iVar6 * 0x30);
            iVar5 = iVar6;
          }
          else {
            pDVar13 = (Dec_Node_t *)realloc(pDVar13,(long)iVar6 * 0x30);
            iVar6 = pGraph->nSize;
            iVar5 = pGraph->nCap;
          }
          pGraph->pNodes = pDVar13;
          pGraph->nCap = iVar5 * 2;
          DVar7 = SUB84(local_50,0);
        }
        local_a8 = (Abc_Obj_t *)((ulong)local_a8 ^ 1);
        pGraph->nSize = iVar6 + 1;
        pDVar13[iVar6].field_2.pFunc = (void *)0x0;
        (&pDVar13[iVar6].field_2)[1].pFunc = (void *)0x0;
        pDVar13[iVar6].eEdge0 = DVar7;
        pDVar13[iVar6].eEdge1 = local_80._0_4_;
        *(uint *)&pDVar13[iVar6].field_0x10 =
             ((uint)local_80._0_4_ & 1) << 0x10 | (uVar16 & 1) << 0xf;
        iVar6 = pGraph->nSize;
        iVar5 = iVar6 * 2;
        uVar16 = iVar5 + 0x7ffffffe;
        pDVar13 = pGraph->pNodes;
        if (iVar6 == pGraph->nCap) {
          if (pDVar13 == (Dec_Node_t *)0x0) {
            pDVar13 = (Dec_Node_t *)malloc((long)iVar5 * 0x18);
          }
          else {
            pDVar13 = (Dec_Node_t *)realloc(pDVar13,(long)iVar5 * 0x18);
            iVar6 = pGraph->nSize;
            iVar5 = pGraph->nCap * 2;
          }
          pGraph->pNodes = pDVar13;
          pGraph->nCap = iVar5;
        }
        pAVar12 = local_58;
        pGraph->nSize = iVar6 + 1;
        pDVar13[iVar6].field_2.pFunc = (void *)0x0;
        (&pDVar13[iVar6].field_2)[1].pFunc = (void *)0x0;
        pDVar13[iVar6].eEdge0 = (Dec_Edge_t)((uint)DVar7 ^ 1);
        pDVar13[iVar6].eEdge1 = local_a8._0_4_;
        *(uint *)&pDVar13[iVar6].field_0x10 =
             ((uint)local_a8._0_4_ & 1) << 0x10 | (((uint)DVar7 ^ 1) & 1) << 0xf;
        iVar6 = pGraph->nSize;
        iVar5 = iVar6 * 2;
        uVar8 = iVar5 + 0x7ffffffe;
        pDVar13 = pGraph->pNodes;
        if (iVar6 == pGraph->nCap) {
          if (pDVar13 == (Dec_Node_t *)0x0) {
            pDVar13 = (Dec_Node_t *)malloc((long)iVar5 * 0x18);
          }
          else {
            pDVar13 = (Dec_Node_t *)realloc(pDVar13,(long)iVar5 * 0x18);
            iVar6 = pGraph->nSize;
            iVar5 = pGraph->nCap * 2;
          }
          pGraph->pNodes = pDVar13;
          pGraph->nCap = iVar5;
        }
        pGraph->nSize = iVar6 + 1;
        pDVar13[iVar6].field_2.pFunc = (void *)0x0;
        (&pDVar13[iVar6].field_2)[1].pFunc = (void *)0x0;
        *(undefined4 *)&pDVar13[iVar6].field_0x10 = 0x4000;
        pDVar13[iVar6].eEdge0 = (Dec_Edge_t)(uVar16 & 0x7ffffffe | 1);
        pDVar13[iVar6].eEdge1 = (Dec_Edge_t)(uVar8 & 0x7ffffffe | 1);
        uVar16 = pGraph->nSize * 2 + 0x7ffffffeU & 0x7ffffffe;
      }
      pVVar10 = local_a0;
      local_d1 = pAVar30 != (Abc_Obj_t *)0x0;
      pDVar13 = pGraph->pNodes;
      uVar18 = *(uint *)(&pDVar13->field_0x10 + local_70 * 8) & 0x3fff;
      uVar8 = *(uint *)(&pDVar13->field_0x10 + (long)local_88 * 8) & 0x3fff;
      uVar23 = *(uint *)(&pDVar13->field_0x10 + (long)local_78 * 8) & 0x3fff;
      if (uVar8 < uVar18) {
        uVar8 = uVar18;
      }
      if (uVar8 <= uVar23) {
        uVar8 = uVar23;
      }
      uVar18 = uVar16 >> 1;
      *(uint *)&pDVar13[uVar18].field_0x10 =
           *(uint *)&pDVar13[uVar18].field_0x10 & 0xffffc000 | uVar8 + 2 & 0x3fff;
      if (local_98 == (Abc_Obj_t *)0x0) {
LAB_002a2386:
        iVar6 = *local_b0;
        *local_b0 = iVar6 + 1;
        bVar25 = (byte)local_68;
        if (local_b4 == 0) {
          if (bVar20) {
            pAVar30 = Abc_AigAndLookup((Abc_Aig_t *)pManRst->pNtk->pManFunc,pAVar12,pAVar27);
            bVar25 = (byte)local_68;
            if ((pAVar30 == (Abc_Obj_t *)0x0) ||
               (iVar6 = Abc_NodeIsTravIdCurrent((Abc_Obj_t *)((ulong)pAVar30 & 0xfffffffffffffffe)),
               iVar6 != 0)) {
              iVar6 = *local_b0 + 1;
              goto LAB_002a248b;
            }
          }
          else {
            iVar6 = iVar6 + 2;
LAB_002a248b:
            *local_b0 = iVar6;
          }
          if ((local_d1 & bVar25) == 1) {
            pAVar21 = (Abc_Aig_t *)pManRst->pNtk->pManFunc;
            pAVar30 = local_60;
            goto LAB_002a24b1;
          }
LAB_002a24cb:
          *local_b0 = *local_b0 + 1;
        }
        else {
          if (bVar20) {
            pAVar30 = Abc_AigAndLookup((Abc_Aig_t *)pManRst->pNtk->pManFunc,pAVar12,
                                       (Abc_Obj_t *)((ulong)pAVar27 ^ 1));
            bVar25 = (byte)local_68;
            if ((pAVar30 == (Abc_Obj_t *)0x0) ||
               (iVar6 = Abc_NodeIsTravIdCurrent((Abc_Obj_t *)((ulong)pAVar30 & 0xfffffffffffffffe)),
               iVar6 != 0)) {
              iVar6 = *local_b0 + 1;
              goto LAB_002a244d;
            }
          }
          else {
            iVar6 = iVar6 + 2;
LAB_002a244d:
            *local_b0 = iVar6;
          }
          if ((local_d1 & bVar25) != 1) goto LAB_002a24cb;
          pAVar21 = (Abc_Aig_t *)pManRst->pNtk->pManFunc;
          pAVar30 = (Abc_Obj_t *)((ulong)local_60 ^ 1);
LAB_002a24b1:
          pAVar30 = Abc_AigAndLookup(pAVar21,(Abc_Obj_t *)((ulong)pAVar12 ^ 1),pAVar30);
          if ((pAVar30 == (Abc_Obj_t *)0x0) ||
             (iVar6 = Abc_NodeIsTravIdCurrent((Abc_Obj_t *)((ulong)pAVar30 & 0xfffffffffffffffe)),
             iVar6 != 0)) goto LAB_002a24cb;
        }
        if (local_8c < *local_b0) {
LAB_002a24e2:
          Vec_IntFree(pVVar10);
          return (Dec_Edge_t)0xfac;
        }
      }
      else {
        pGraph->pNodes[uVar18].field_2.pFunc = (void *)((ulong)(uVar16 & 1) ^ (ulong)local_98);
        if ((local_90 != 1000000000) &&
           ((*(uint *)&pGraph->pNodes[uVar18].field_0x10 & 0x3fff) !=
            *(uint *)(((ulong)local_98 & 0xfffffffffffffffe) + 0x14) >> 0xc)) {
          __assert_fail("Required == ABC_INFINITY || Level4 == (int)Abc_ObjRegular(pNode4)->Level",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcRestruct.c"
                        ,0x346,
                        "Dec_Edge_t Abc_NodeEvaluateDsd_rec(Dec_Graph_t *, Abc_ManRst_t *, Dsd_Node_t *, int, int, int *)"
                       );
        }
        iVar6 = Abc_NodeIsTravIdCurrent((Abc_Obj_t *)((ulong)local_98 & 0xfffffffffffffffe));
        if (iVar6 != 0) goto LAB_002a2386;
      }
      Vec_IntFree(pVVar10);
      local_48._0_4_ = uVar16 ^ (uint)local_48;
      uVar16 = uVar16 & 0xfffffffe;
      goto LAB_002a1500;
    }
    uVar16 = pVVar10->nSize;
    if ((int)uVar16 < 2) {
      __assert_fail("Vec_IntSize(vEdges) > 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcRestruct.c"
                    ,0x27e,
                    "Dec_Edge_t Abc_NodeEvaluateDsd_rec(Dec_Graph_t *, Abc_ManRst_t *, Dsd_Node_t *, int, int, int *)"
                   );
    }
    do {
      if (uVar16 != 2) {
        Abc_NodeEdgeDsdPermute(pGraph,pManRst,pVVar10,0);
      }
      uVar8 = pVVar10->pArray[(ulong)uVar16 - 1];
      pAVar27 = (Abc_Obj_t *)(ulong)uVar8;
      pVVar10->nSize = uVar16 - 2;
      uVar16 = pVVar10->pArray[uVar16 - 2];
      uVar19 = (ulong)((uVar8 & 0x7fffffff) >> 1);
      uVar22 = uVar19 * 3;
      pvVar2 = pGraph->pNodes[uVar19].field_2.pFunc;
      uVar19 = (ulong)((uVar16 & 0x7fffffff) >> 1);
      pAVar30 = (Abc_Obj_t *)(uVar19 * 3);
      pvVar17 = pGraph->pNodes[uVar19].field_2.pFunc;
      uVar19 = (ulong)(uVar8 & 1) ^ (ulong)pvVar2;
      if (pvVar2 == (void *)0x0) {
        uVar19 = 0;
      }
      if ((pvVar17 == (void *)0x0) || (uVar19 == 0)) {
        uVar26 = 0;
      }
      else {
        uVar26 = 0;
        if ((void *)(ulong)(uVar16 & 1) != pvVar17) {
          local_a8 = pAVar27;
          pAVar12 = Abc_AigAndLookup((Abc_Aig_t *)pManRst->pNtk->pManFunc,(Abc_Obj_t *)(uVar19 ^ 1),
                                     (Abc_Obj_t *)((ulong)(uVar16 & 1) ^ (ulong)pvVar17 ^ 1));
          pVVar10 = local_a0;
          pAVar27 = local_a8;
          if (pAVar12 == (Abc_Obj_t *)0x0) {
            uVar26 = 0;
          }
          else {
            uVar26 = (ulong)pAVar12 ^ 1;
          }
        }
      }
      iVar6 = pGraph->nSize;
      pDVar13 = pGraph->pNodes;
      if (iVar6 == pGraph->nCap) {
        local_a8 = pAVar27;
        local_98 = pAVar30;
        local_80 = uVar22;
        if (pDVar13 == (Dec_Node_t *)0x0) {
          pDVar13 = (Dec_Node_t *)malloc((long)iVar6 * 0x30);
          iVar5 = iVar6;
        }
        else {
          pDVar13 = (Dec_Node_t *)realloc(pDVar13,(long)iVar6 * 0x30);
          iVar6 = pGraph->nSize;
          iVar5 = pGraph->nCap;
        }
        pGraph->pNodes = pDVar13;
        pGraph->nCap = iVar5 * 2;
        uVar22 = local_80;
        pAVar30 = local_98;
        pAVar27 = local_a8;
        pVVar10 = local_a0;
      }
      piVar11 = local_b0;
      pGraph->nSize = iVar6 + 1;
      pDVar13[iVar6].field_2.pFunc = (void *)0x0;
      (&pDVar13[iVar6].field_2)[1].pFunc = (void *)0x0;
      *(uint *)&pDVar13[iVar6].field_0x10 =
           ((uint)pAVar27 & 1) * 0x8000 + (uVar16 & 1) * 0x10000 + 0x4000;
      pDVar13[iVar6].eEdge0 = (Dec_Edge_t)(uVar8 & 0x7fffffff ^ 1);
      pDVar13[iVar6].eEdge1 = (Dec_Edge_t)(uVar16 & 0x7fffffff ^ 1);
      uVar18 = pGraph->nSize * 2 + 0x7ffffffeU & 0x7ffffffe;
      pDVar13 = pGraph->pNodes;
      uVar8 = *(uint *)(&pDVar13->field_0x10 + uVar22 * 8) & 0x3fff;
      uVar16 = *(uint *)(&pDVar13->field_0x10 + (long)pAVar30 * 8) & 0x3fff;
      if (uVar16 < uVar8) {
        uVar16 = uVar8;
      }
      uVar8 = uVar18 >> 1;
      *(uint *)&pDVar13[uVar8].field_0x10 =
           *(uint *)&pDVar13[uVar8].field_0x10 & 0xffffc000 | uVar16 + 1 & 0x3fff;
      if (uVar26 == 0) {
LAB_002a149f:
        iVar6 = *piVar11;
        *piVar11 = iVar6 + 1;
        if (local_8c <= iVar6) goto LAB_002a2069;
      }
      else {
        pDVar13 = pGraph->pNodes;
        pDVar13[uVar8].field_2.pFunc = (void *)(uVar26 ^ 1);
        if ((local_90 != 1000000000) &&
           ((*(uint *)&pGraph->pNodes[uVar8].field_0x10 & 0x3fff) !=
            *(uint *)((uVar26 & 0xfffffffffffffffe) + 0x14) >> 0xc)) {
          __assert_fail("Required == ABC_INFINITY || Level3 == (int)Abc_ObjRegular(pNode3)->Level",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcRestruct.c"
                        ,0x29d,
                        "Dec_Edge_t Abc_NodeEvaluateDsd_rec(Dec_Graph_t *, Abc_ManRst_t *, Dsd_Node_t *, int, int, int *)"
                       );
        }
        plVar24 = (long *)(uVar26 & 0xfffffffffffffffe);
        lVar3 = *plVar24;
        iVar6 = (int)plVar24[2];
        Vec_IntFillExtra((Vec_Int_t *)(lVar3 + 0xe0),iVar6 + 1,(int)pDVar13);
        if (((long)iVar6 < 0) || (*(int *)(lVar3 + 0xe4) <= iVar6)) goto LAB_002a26ae;
        if (*(int *)(*(long *)(lVar3 + 0xe8) + (long)iVar6 * 4) == *(int *)(*plVar24 + 0xd8))
        goto LAB_002a149f;
      }
      Abc_NodeEdgeDsdPushOrdered(pGraph,pVVar10,uVar18 + 1);
      uVar16 = pVVar10->nSize;
    } while (1 < (int)uVar16);
  }
  if (uVar16 != 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x3b1,"int Vec_IntPop(Vec_Int_t *)");
  }
  uVar16 = *pVVar10->pArray;
  free(pVVar10->pArray);
  free(pVVar10);
  local_48._0_4_ = uVar16 ^ (uint)local_48;
  uVar16 = uVar16 & 0x7ffffffe;
LAB_002a1500:
  return (Dec_Edge_t)(uVar16 | (uint)local_48 & 1);
}

Assistant:

Dec_Edge_t Abc_NodeEvaluateDsd_rec( Dec_Graph_t * pGraph, Abc_ManRst_t * pManRst, Dsd_Node_t * pNodeDsd, int Required, int nNodesSaved, int * pnNodesAdded )
{
    Dec_Edge_t eNode1, eNode2, eNode3, eResult, eQuit = { 0, 2006 };
    Abc_Obj_t * pNode1, * pNode2, * pNode3, * pNode4, * pTemp;
    Dsd_Node_t * pChildDsd;
    Dsd_Type_t DecType;
    Vec_Int_t * vEdges;
    int Level1, Level2, Level3, Level4;
    int i, Index, fCompl, Type;

    // remove the complemented attribute
    fCompl   = Dsd_IsComplement( pNodeDsd );
    pNodeDsd = Dsd_Regular( pNodeDsd );

    // consider the trivial case
    DecType = Dsd_NodeReadType( pNodeDsd );
    if ( DecType == DSD_NODE_BUF )
    {
        Index = Dsd_NodeReadFunc(pNodeDsd)->index;
        assert( Index < Dec_GraphLeaveNum(pGraph) );
        eResult = Dec_EdgeCreate( Index, fCompl );
        return eResult;
    }
    assert( DecType == DSD_NODE_OR || DecType == DSD_NODE_EXOR || DecType == DSD_NODE_PRIME );

    // solve the problem for the children
    vEdges = Vec_IntAlloc( Dsd_NodeReadDecsNum(pNodeDsd) );
    Dsd_NodeForEachChild( pNodeDsd, i, pChildDsd )
    {
        eResult = Abc_NodeEvaluateDsd_rec( pGraph, pManRst, pChildDsd, Required, nNodesSaved, pnNodesAdded );
        if ( eResult.Node == eQuit.Node ) // infeasible
        {
            Vec_IntFree( vEdges );
            return eQuit;
        }
        // order the inputs only if this is OR or EXOR
        if ( DecType == DSD_NODE_PRIME )
            Vec_IntPush( vEdges, Dec_EdgeToInt(eResult) );
        else
            Abc_NodeEdgeDsdPushOrdered( pGraph, vEdges, Dec_EdgeToInt(eResult) );
    }
    // the edges are sorted by the level of their nodes in decreasing order


    // consider special cases
    if ( DecType == DSD_NODE_OR )
    {
        // try to balance the nodes by delay
        assert( Vec_IntSize(vEdges) > 1 );
        while ( Vec_IntSize(vEdges) > 1 )
        {
            // permute the last two entries
            if ( Vec_IntSize(vEdges) > 2 )
                Abc_NodeEdgeDsdPermute( pGraph, pManRst, vEdges, 0 );
            // get the two last nodes
            eNode1 = Dec_IntToEdge( Vec_IntPop(vEdges) );
            eNode2 = Dec_IntToEdge( Vec_IntPop(vEdges) );
            pNode1 = (Abc_Obj_t *)Dec_GraphNode( pGraph, eNode1.Node )->pFunc;
            pNode2 = (Abc_Obj_t *)Dec_GraphNode( pGraph, eNode2.Node )->pFunc;
            pNode1 = !pNode1? NULL : Abc_ObjNotCond( pNode1, eNode1.fCompl );
            pNode2 = !pNode2? NULL : Abc_ObjNotCond( pNode2, eNode2.fCompl );
            // check if the new node exists
            pNode3 = NULL;
            if ( pNode1 && pNode2 )
            {
                pNode3 = Abc_AigAndLookup( (Abc_Aig_t *)pManRst->pNtk->pManFunc, Abc_ObjNot(pNode1), Abc_ObjNot(pNode2) ); 
                pNode3 = !pNode3? NULL : Abc_ObjNot(pNode3);
            }
            // create the new node
            eNode3 = Dec_GraphAddNodeOr( pGraph, eNode1, eNode2 );
            // set level
            Level1 = Dec_GraphNode( pGraph, eNode1.Node )->Level;
            Level2 = Dec_GraphNode( pGraph, eNode2.Node )->Level;
            Dec_GraphNode( pGraph, eNode3.Node )->Level = 1 + Abc_MaxInt(Level1, Level2);
            // get the new node if possible
            if ( pNode3 )
            {
                Dec_GraphNode( pGraph, eNode3.Node )->pFunc = Abc_ObjNotCond(pNode3, eNode3.fCompl);
                Level3 = Dec_GraphNode( pGraph, eNode3.Node )->Level;
                assert( Required == ABC_INFINITY || Level3 == (int)Abc_ObjRegular(pNode3)->Level );
            }
            if ( !pNode3 || Abc_NodeIsTravIdCurrent(Abc_ObjRegular(pNode3)) )
            {
                (*pnNodesAdded)++;
                if ( *pnNodesAdded > nNodesSaved )
                {
                    Vec_IntFree( vEdges );
                    return eQuit;
                }
            }
            // add the resulting node to the form
            Abc_NodeEdgeDsdPushOrdered( pGraph, vEdges, Dec_EdgeToInt(eNode3) );
        }
        // get the last node
        eResult = Dec_IntToEdge( Vec_IntPop(vEdges) );
        Vec_IntFree( vEdges );
        // complement the graph if the node was complemented
        eResult.fCompl ^= fCompl;
        return eResult;
    }
    if ( DecType == DSD_NODE_EXOR )
    {
        // try to balance the nodes by delay
        assert( Vec_IntSize(vEdges) > 1 );
        while ( Vec_IntSize(vEdges) > 1 )
        {
            // permute the last two entries
            if ( Vec_IntSize(vEdges) > 2 )
                Abc_NodeEdgeDsdPermute( pGraph, pManRst, vEdges, 1 );
            // get the two last nodes
            eNode1 = Dec_IntToEdge( Vec_IntPop(vEdges) );
            eNode2 = Dec_IntToEdge( Vec_IntPop(vEdges) );
            pNode1 = (Abc_Obj_t *)Dec_GraphNode( pGraph, eNode1.Node )->pFunc;
            pNode2 = (Abc_Obj_t *)Dec_GraphNode( pGraph, eNode2.Node )->pFunc;
            pNode1 = !pNode1? NULL : Abc_ObjNotCond( pNode1, eNode1.fCompl );
            pNode2 = !pNode2? NULL : Abc_ObjNotCond( pNode2, eNode2.fCompl );
            // check if the new node exists
            Type = 0;
            pNode3 = NULL;
            if ( pNode1 && pNode2 )
                pNode3 = Abc_AigXorLookup( (Abc_Aig_t *)pManRst->pNtk->pManFunc, pNode1, pNode2, &Type ); 
            // create the new node
            eNode3 = Dec_GraphAddNodeXor( pGraph, eNode1, eNode2, Type ); // should have the same structure as in AIG
            // set level
            Level1 = Dec_GraphNode( pGraph, eNode1.Node )->Level;
            Level2 = Dec_GraphNode( pGraph, eNode2.Node )->Level;
            Dec_GraphNode( pGraph, eNode3.Node )->Level = 2 + Abc_MaxInt(Level1, Level2);
            // get the new node if possible
            if ( pNode3 )
            {
                Dec_GraphNode( pGraph, eNode3.Node )->pFunc = Abc_ObjNotCond(pNode3, eNode3.fCompl);
                Level3 = Dec_GraphNode( pGraph, eNode3.Node )->Level;
                assert( Required == ABC_INFINITY || Level3 == (int)Abc_ObjRegular(pNode3)->Level );
            }
            if ( !pNode3 || Abc_NodeIsTravIdCurrent(Abc_ObjRegular(pNode3)) )
            {
                (*pnNodesAdded)++;
                if ( !pNode1 || !pNode2 )
                    (*pnNodesAdded) += 2;
                else if ( Type == 0 )
                {
                    pTemp = Abc_AigAndLookup( (Abc_Aig_t *)pManRst->pNtk->pManFunc, pNode1, Abc_ObjNot(pNode2) );
                    if ( !pTemp || Abc_NodeIsTravIdCurrent(Abc_ObjRegular(pTemp)) )
                        (*pnNodesAdded)++;
                    pTemp = Abc_AigAndLookup( (Abc_Aig_t *)pManRst->pNtk->pManFunc, Abc_ObjNot(pNode1), pNode2 );
                    if ( !pTemp || Abc_NodeIsTravIdCurrent(Abc_ObjRegular(pTemp)) )
                        (*pnNodesAdded)++;
                }
                else
                {
                    pTemp = Abc_AigAndLookup( (Abc_Aig_t *)pManRst->pNtk->pManFunc, Abc_ObjNot(pNode1), Abc_ObjNot(pNode2) );
                    if ( !pTemp || Abc_NodeIsTravIdCurrent(Abc_ObjRegular(pTemp)) )
                        (*pnNodesAdded)++;
                    pTemp = Abc_AigAndLookup( (Abc_Aig_t *)pManRst->pNtk->pManFunc, pNode1, pNode2 );
                    if ( !pTemp || Abc_NodeIsTravIdCurrent(Abc_ObjRegular(pTemp)) )
                        (*pnNodesAdded)++;
                }
                if ( *pnNodesAdded > nNodesSaved )
                {
                    Vec_IntFree( vEdges );
                    return eQuit;
                }
            }
            // add the resulting node to the form
            Abc_NodeEdgeDsdPushOrdered( pGraph, vEdges, Dec_EdgeToInt(eNode3) );
        }
        // get the last node
        eResult = Dec_IntToEdge( Vec_IntPop(vEdges) );
        Vec_IntFree( vEdges );
        // complement the graph if the node is complemented
        eResult.fCompl ^= fCompl;
        return eResult;
    }
    if ( DecType == DSD_NODE_PRIME )
    {
        DdNode * bLocal, * bVar, * bCofT, * bCofE;
        bLocal = Dsd_TreeGetPrimeFunction( pManRst->dd, pNodeDsd );  Cudd_Ref( bLocal );
//Extra_bddPrint( pManRst->dd, bLocal );

        bVar  = pManRst->dd->vars[0];
        bCofE = Cudd_Cofactor( pManRst->dd, bLocal, Cudd_Not(bVar) );  Cudd_Ref( bCofE );
        bCofT = Cudd_Cofactor( pManRst->dd, bLocal, bVar );            Cudd_Ref( bCofT );
        if ( !Extra_bddIsVar(bCofE) || !Extra_bddIsVar(bCofT) )
        {
            Cudd_RecursiveDeref( pManRst->dd, bCofE );
            Cudd_RecursiveDeref( pManRst->dd, bCofT );
            bVar  = pManRst->dd->vars[1];
            bCofE = Cudd_Cofactor( pManRst->dd, bLocal, Cudd_Not(bVar) );  Cudd_Ref( bCofE );
            bCofT = Cudd_Cofactor( pManRst->dd, bLocal, bVar );            Cudd_Ref( bCofT );
            if ( !Extra_bddIsVar(bCofE) || !Extra_bddIsVar(bCofT) )
            {
                Cudd_RecursiveDeref( pManRst->dd, bCofE );
                Cudd_RecursiveDeref( pManRst->dd, bCofT );
                bVar  = pManRst->dd->vars[2];
                bCofE = Cudd_Cofactor( pManRst->dd, bLocal, Cudd_Not(bVar) );  Cudd_Ref( bCofE );
                bCofT = Cudd_Cofactor( pManRst->dd, bLocal, bVar );            Cudd_Ref( bCofT );
                if ( !Extra_bddIsVar(bCofE) || !Extra_bddIsVar(bCofT) )
                {
                    Cudd_RecursiveDeref( pManRst->dd, bCofE );
                    Cudd_RecursiveDeref( pManRst->dd, bCofT );
                    Cudd_RecursiveDeref( pManRst->dd, bLocal );
                    Vec_IntFree( vEdges );
                    return eQuit;
                }
            }
        }
        Cudd_RecursiveDeref( pManRst->dd, bLocal );
        // we found the control variable (bVar) and the var-cofactors (bCofT, bCofE)

        // find the graph nodes
        eNode1 = Dec_IntToEdge( Vec_IntEntry(vEdges, bVar->index) );
        eNode2 = Dec_IntToEdge( Vec_IntEntry(vEdges, Cudd_Regular(bCofT)->index) );
        eNode3 = Dec_IntToEdge( Vec_IntEntry(vEdges, Cudd_Regular(bCofE)->index) );
        // add the complements to the graph nodes
        eNode2.fCompl ^= Cudd_IsComplement(bCofT);
        eNode3.fCompl ^= Cudd_IsComplement(bCofE);

        // because the cofactors are vars, we can just as well deref them here
        Cudd_RecursiveDeref( pManRst->dd, bCofE );
        Cudd_RecursiveDeref( pManRst->dd, bCofT );

        // find the ABC nodes
        pNode1 = (Abc_Obj_t *)Dec_GraphNode( pGraph, eNode1.Node )->pFunc;
        pNode2 = (Abc_Obj_t *)Dec_GraphNode( pGraph, eNode2.Node )->pFunc;
        pNode3 = (Abc_Obj_t *)Dec_GraphNode( pGraph, eNode3.Node )->pFunc;
        pNode1 = !pNode1? NULL : Abc_ObjNotCond( pNode1, eNode1.fCompl );
        pNode2 = !pNode2? NULL : Abc_ObjNotCond( pNode2, eNode2.fCompl );
        pNode3 = !pNode3? NULL : Abc_ObjNotCond( pNode3, eNode3.fCompl );

        // check if the new node exists
        Type = 0;
        pNode4 = NULL;
        if ( pNode1 && pNode2 && pNode3 )
            pNode4 = Abc_AigMuxLookup( (Abc_Aig_t *)pManRst->pNtk->pManFunc, pNode1, pNode2, pNode3, &Type ); 

        // create the new node
        eResult = Dec_GraphAddNodeMux( pGraph, eNode1, eNode2, eNode3, Type ); // should have the same structure as AIG

        // set level
        Level1 = Dec_GraphNode( pGraph, eNode1.Node )->Level;
        Level2 = Dec_GraphNode( pGraph, eNode2.Node )->Level;
        Level3 = Dec_GraphNode( pGraph, eNode3.Node )->Level;
        Dec_GraphNode( pGraph, eResult.Node )->Level = 2 + Abc_MaxInt( Abc_MaxInt(Level1, Level2), Level3 );
        // get the new node if possible
        if ( pNode4 )
        {
            Dec_GraphNode( pGraph, eResult.Node )->pFunc = Abc_ObjNotCond(pNode4, eResult.fCompl);
            Level4 = Dec_GraphNode( pGraph, eResult.Node )->Level;
            assert( Required == ABC_INFINITY || Level4 == (int)Abc_ObjRegular(pNode4)->Level );
        }
        if ( !pNode4 || Abc_NodeIsTravIdCurrent(Abc_ObjRegular(pNode4)) )
        {
            (*pnNodesAdded)++;
            if ( Type == 0 ) 
            {
                if ( !pNode1 || !pNode2 )
                    (*pnNodesAdded)++;
                else
                {
                    pTemp = Abc_AigAndLookup( (Abc_Aig_t *)pManRst->pNtk->pManFunc, pNode1, pNode2 );
                    if ( !pTemp || Abc_NodeIsTravIdCurrent(Abc_ObjRegular(pTemp)) )
                        (*pnNodesAdded)++;
                }
                if ( !pNode1 || !pNode3 )
                    (*pnNodesAdded)++;
                else
                {
                    pTemp = Abc_AigAndLookup( (Abc_Aig_t *)pManRst->pNtk->pManFunc, Abc_ObjNot(pNode1), pNode3 );
                    if ( !pTemp || Abc_NodeIsTravIdCurrent(Abc_ObjRegular(pTemp)) )
                        (*pnNodesAdded)++;
                }
            }
            else
            {
                if ( !pNode1 || !pNode2 )
                    (*pnNodesAdded)++;
                else
                {
                    pTemp = Abc_AigAndLookup( (Abc_Aig_t *)pManRst->pNtk->pManFunc, pNode1, Abc_ObjNot(pNode2) );
                    if ( !pTemp || Abc_NodeIsTravIdCurrent(Abc_ObjRegular(pTemp)) )
                        (*pnNodesAdded)++;
                }
                if ( !pNode1 || !pNode3 )
                    (*pnNodesAdded)++;
                else
                {
                    pTemp = Abc_AigAndLookup( (Abc_Aig_t *)pManRst->pNtk->pManFunc, Abc_ObjNot(pNode1), Abc_ObjNot(pNode3) );
                    if ( !pTemp || Abc_NodeIsTravIdCurrent(Abc_ObjRegular(pTemp)) )
                        (*pnNodesAdded)++;
                }
            }
            if ( *pnNodesAdded > nNodesSaved )
            {
                Vec_IntFree( vEdges );
                return eQuit;
            }
        }

        Vec_IntFree( vEdges );
        // complement the graph if the node was complemented
        eResult.fCompl ^= fCompl;
        return eResult;
    }
    Vec_IntFree( vEdges );
    return eQuit;
}